

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5ImagesArrayIndexing.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GPUShader5ImagesArrayIndexing::iterate(GPUShader5ImagesArrayIndexing *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ulong uVar5;
  GLuint *pGVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  MessageBuilder local_1d0;
  GLuint *local_50;
  GLuint *data;
  GLuint *pGStack_40;
  GLint x;
  GLuint *data_row;
  GLuint local_30;
  GLint y;
  GLuint resultExpected [1];
  uint i;
  GLuint dataSize;
  GLuint index;
  Functions *gl;
  GPUShader5ImagesArrayIndexing *this_local;
  long lVar4;
  
  initTest(this);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x1680))(this->m_program_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glUseProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xae);
  for (i = 0; i < 4; i = i + 1) {
    (**(code **)(lVar4 + 0x80))(i,this->m_to_ids[i],0,0,0,0x88ba,0x8236);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not bind a texture object to image unit!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xb5);
  }
  (**(code **)(lVar4 + 0x528))(1,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Failed to dispatch compute operation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xbb);
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_fbo_id);
  (**(code **)(lVar4 + 0x78))(0x8ca8,this->m_fbo_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not create framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xc1);
  (**(code **)(lVar4 + 0x1a00))(0,0,this->m_texture_width,this->m_texture_height);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glViewport() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xc5);
  resultExpected[0] = this->m_texture_width * this->m_texture_height * 4;
  uVar5 = SUB168(ZEXT416(resultExpected[0]) * ZEXT816(4),0);
  if (SUB168(ZEXT416(resultExpected[0]) * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pGVar6 = (GLuint *)operator_new__(uVar5);
  this->m_data_buffer = pGVar6;
  (**(code **)(lVar4 + 0xdb8))(0x80);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"Could not set memory barrier!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                  ,0xcc);
  y = 0;
  do {
    if (3 < (uint)y) {
      if (this->m_data_buffer != (GLuint *)0x0) {
        operator_delete__(this->m_data_buffer);
      }
      this->m_data_buffer = (GLuint *)0x0;
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    (**(code **)(lVar4 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_to_ids[(uint)y],0);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Error configuring color attachment for framebuffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xd2);
    (**(code **)(lVar4 + 0x1220))
              (0,0,this->m_texture_width,this->m_texture_height,0x8d99,0x1405,this->m_data_buffer);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glReadPixels() call failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5ImagesArrayIndexing.cpp"
                    ,0xd7);
    for (data_row._4_4_ = 0; data_row._4_4_ < this->m_texture_height;
        data_row._4_4_ = data_row._4_4_ + 1) {
      pGStack_40 = this->m_data_buffer + data_row._4_4_ * this->m_texture_width * 4;
      for (data._4_4_ = 0; data._4_4_ < this->m_texture_width; data._4_4_ = data._4_4_ + 1) {
        local_50 = pGStack_40 + (data._4_4_ << 2);
        local_30 = data._4_4_ + data_row._4_4_ + 1 + y;
        if (local_30 != *local_50) {
          this_00 = tcu::TestContext::getLog
                              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_1d0,
                              (char (*) [48])"Invalid image data acquired for image at index ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uint *)&y);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])", position: (");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&data + 4));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&data_row + 4));
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a94734);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [18])". Rendered data [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_50);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x29ea7ce);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])" Expected data [");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_30);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x29ea7ce);
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1d0);
          if (this->m_data_buffer != (GLuint *)0x0) {
            operator_delete__(this->m_data_buffer);
          }
          this->m_data_buffer = (GLuint *)0x0;
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
          return STOP;
        }
      }
    }
    y = y + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShader5ImagesArrayIndexing::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.useProgram(m_program_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	for (glw::GLuint index = 0; index < m_array_size; index++)
	{
		gl.bindImageTexture(index /* unit */, m_to_ids[index], 0 /* level */, GL_FALSE, /* layered */
							0,															/* layer */
							GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a texture object to image unit!");
	}

	gl.dispatchCompute(1,  /* num_groups_x */
					   1,  /* num_groups_y */
					   1); /* num_groups_z */
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch compute operation");

	/* Create and configure a framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer object");

	/* Set viewport */
	gl.viewport(0, 0, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed");

	/* Allocate space for result data */
	const glw::GLuint dataSize = m_texture_width * m_texture_height * m_texture_n_components * 4;
	m_data_buffer			   = new glw::GLuint[dataSize];

	gl.memoryBarrier(GL_PIXEL_BUFFER_BARRIER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set memory barrier!");

	for (unsigned int i = 0; i < m_array_size; ++i)
	{
		/* Attach texture to framebuffer's color attachment 0 */
		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_ids[i], 0 /* level */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring color attachment for framebuffer object!");

		/* Read the rendered data */
		gl.readPixels(0 /* x */, 0 /* y */, m_texture_width, m_texture_height, GL_RGBA_INTEGER, GL_UNSIGNED_INT,
					  m_data_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed!");

		glw::GLuint resultExpected[m_texture_n_components];

		/* Loop over all pixels and compare the rendered data with reference value */
		for (glw::GLint y = 0; y < m_texture_height; ++y)
		{
			glw::GLuint* data_row = m_data_buffer + y * m_texture_width * m_texture_n_components * 4;

			for (glw::GLint x = 0; x < m_texture_width; ++x)
			{
				glw::GLuint* data = data_row + x * m_texture_n_components * 4;

				resultExpected[0] = x + y + 1 + i;

				if (resultExpected[0] != data[0])
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid image data acquired for image at index "
									   << i << ", position: (" << x << "," << y << ")"
									   << ". Rendered data [" << data[0] << "]"
									   << " Expected data [" << resultExpected[0] << "]" << tcu::TestLog::EndMessage;

					delete[] m_data_buffer;
					m_data_buffer = DE_NULL;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				} /* if (data mismatch) */

			} /* for (all columns) */
		}	 /* for (all rows) */
	}		  /*for (m_sizeOfArray)*/

	delete[] m_data_buffer;
	m_data_buffer = DE_NULL;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}